

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_expect_uint_match(mpack_reader_t *reader,uint64_t value)

{
  uint64_t uVar1;
  
  uVar1 = mpack_expect_u64(reader);
  if (uVar1 == value) {
    return;
  }
  mpack_reader_flag_error(reader,mpack_error_type);
  return;
}

Assistant:

void mpack_expect_uint_match(mpack_reader_t* reader, uint64_t value) {
    if (mpack_expect_u64(reader) != value)
        mpack_reader_flag_error(reader, mpack_error_type);
}